

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

int __thiscall helics::TimeCoordinator::getIntegerProperty(TimeCoordinator *this,int intProperty)

{
  int in_ESI;
  long in_RDI;
  memory_order __b;
  undefined4 local_18;
  
  if (in_ESI == 0x102) {
    std::operator&(seq_cst,__memory_order_mask);
    local_18 = *(int *)(in_RDI + 0x260);
  }
  else if (in_ESI == 0x103) {
    local_18 = *(int *)(in_RDI + 0x254);
  }
  else {
    local_18 = -0x3cc;
  }
  return local_18;
}

Assistant:

int TimeCoordinator::getIntegerProperty(int intProperty) const
{
    switch (intProperty) {  // NOLINT
        case defs::Properties::MAX_ITERATIONS:
            return info.maxIterations;
        case defs::Properties::CURRENT_ITERATION:
            return iteration.load();
        default:
            return HELICS_INVALID_PROPERTY_VALUE;
    }
}